

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O3

int virtual_print_insn(dill_stream c,void *info_ptr,void *i)

{
  byte bVar1;
  private_ctx pdVar2;
  int iVar3;
  char **ppcVar4;
  long lVar5;
  char *pcVar6;
  virtual_insn *insn;
  ulong uVar7;
  undefined8 uVar8;
  uint uVar9;
  char *pcVar10;
  char *__format;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  
  if (0x18 < *i) {
    return 0x28;
  }
  bVar1 = *(byte *)((long)i + 1);
  uVar9 = (uint)bVar1;
  switch(*i) {
  case 0:
    ppcVar4 = arith3_name;
    goto LAB_0010c9eb;
  case 1:
    pcVar10 = arith3_name[(char)bVar1];
    uVar13 = (ulong)*(int *)((long)i + 8);
    uVar9 = 0x50;
    uVar14 = 0x50;
    if (99 < (long)uVar13) {
      iVar3 = dill_type_of(c,*(int *)((long)i + 8));
      uVar14 = (uint)(iVar3 != 0xc) << 4 | 0x42;
      uVar13 = (ulong)*(uint *)((long)i + 8);
    }
    uVar15 = (ulong)*(int *)((long)i + 0xc);
    if (99 < (long)uVar15) {
      iVar3 = dill_type_of(c,*(int *)((long)i + 0xc));
      uVar9 = (uint)(iVar3 != 0xc) << 4 | 0x42;
      uVar15 = (ulong)*(uint *)((long)i + 0xc);
    }
    pcVar11 = "%s%s%si %c%d, %c%d, %zu";
    uVar12 = *(ulong *)((long)i + 0x10);
    goto LAB_0010caa1;
  case 2:
    pcVar10 = arith2_name[(char)bVar1];
    uVar13 = (ulong)*(int *)((long)i + 8);
    uVar9 = 0x50;
    uVar14 = 0x50;
    if (99 < (long)uVar13) {
      iVar3 = dill_type_of(c,*(int *)((long)i + 8));
      uVar14 = (uint)(iVar3 != 0xc) << 4 | 0x42;
      uVar13 = (ulong)*(uint *)((long)i + 8);
    }
    uVar15 = (ulong)*(int *)((long)i + 0xc);
    if (99 < (long)uVar15) {
      iVar3 = dill_type_of(c,*(int *)((long)i + 0xc));
      uVar9 = (uint)(iVar3 != 0xc) << 4 | 0x42;
      uVar15 = (ulong)*(uint *)((long)i + 0xc);
    }
    pcVar11 = "%s %c%d, %c%d";
    goto LAB_0010c527;
  case 3:
    pcVar10 = dill_type_names[uVar9 & 0xf];
    uVar15 = (ulong)*(int *)((long)i + 8);
    if ((long)uVar15 < 100) {
      uVar13 = 0x50;
    }
    else {
      iVar3 = dill_type_of(c,*(int *)((long)i + 8));
      uVar13 = (ulong)((uint)(iVar3 != 0xc) << 4 | 0x42);
      uVar15 = (ulong)*(uint *)((long)i + 8);
    }
    pcVar11 = "ret%s %c%d";
    goto LAB_0010cb60;
  case 4:
    pcVar10 = dill_type_names[bVar1 >> 4];
    pcVar11 = dill_type_names[uVar9 & 0xf];
    uVar13 = (ulong)*(int *)((long)i + 8);
    uVar9 = 0x50;
    uVar14 = 0x50;
    if (99 < (long)uVar13) {
      iVar3 = dill_type_of(c,*(int *)((long)i + 8));
      uVar14 = (uint)(iVar3 != 0xc) << 4 | 0x42;
      uVar13 = (ulong)*(uint *)((long)i + 8);
    }
    uVar15 = (ulong)*(int *)((long)i + 0xc);
    if (99 < (long)uVar15) {
      iVar3 = dill_type_of(c,*(int *)((long)i + 0xc));
      uVar9 = (uint)(iVar3 != 0xc) << 4 | 0x42;
      uVar15 = (ulong)*(uint *)((long)i + 0xc);
    }
    printf("cv%s2%s %c%d, %c%d",pcVar10,pcVar11,(ulong)uVar14,uVar13 & 0xffffffff,(ulong)uVar9,
           uVar15);
    break;
  case 5:
    pcVar10 = "bs";
    if ((bVar1 & 0x20) == 0) {
      pcVar10 = "";
    }
    pcVar11 = "st";
    if ((bVar1 & 0x10) == 0) {
      pcVar11 = "ld";
    }
    pcVar6 = dill_type_names[uVar9 & 0xf];
    uVar9 = *(uint *)((long)i + 8);
    uVar13 = 0x50;
    uVar14 = 0x50;
    if (99 < (int)uVar9) {
      iVar3 = dill_type_of(c,uVar9);
      uVar14 = (uint)(iVar3 != 0xc) << 4 | 0x42;
      uVar9 = *(uint *)((long)i + 8);
    }
    uVar15 = (ulong)*(int *)((long)i + 0xc);
    if (99 < (long)uVar15) {
      iVar3 = dill_type_of(c,*(int *)((long)i + 0xc));
      uVar13 = (ulong)((uint)(iVar3 != 0xc) << 4 | 0x42);
      uVar15 = (ulong)*(uint *)((long)i + 0xc);
    }
    if (*(int *)((long)i + 0x10) < 100) {
      uVar12 = 0x50;
    }
    else {
      iVar3 = dill_type_of(c,*(int *)((long)i + 0x10));
      uVar12 = (ulong)((uint)(iVar3 != 0xc) << 4 | 0x42);
    }
    __format = "%s%s%s %c%d, %c%d, %c%d";
    goto LAB_0010cc2c;
  case 6:
    pcVar10 = "bs";
    if ((bVar1 & 0x20) == 0) {
      pcVar10 = "";
    }
    pcVar11 = "st";
    if ((bVar1 & 0x10) == 0) {
      pcVar11 = "ld";
    }
    pcVar6 = dill_type_names[uVar9 & 0xf];
    uVar9 = *(uint *)((long)i + 8);
    uVar13 = 0x50;
    uVar14 = 0x50;
    if (99 < (int)uVar9) {
      iVar3 = dill_type_of(c,uVar9);
      uVar14 = (uint)(iVar3 != 0xc) << 4 | 0x42;
      uVar9 = *(uint *)((long)i + 8);
    }
    uVar15 = (ulong)*(int *)((long)i + 0xc);
    if (99 < (long)uVar15) {
      iVar3 = dill_type_of(c,*(int *)((long)i + 0xc));
      uVar13 = (ulong)((uint)(iVar3 != 0xc) << 4 | 0x42);
      uVar15 = (ulong)*(uint *)((long)i + 0xc);
    }
    __format = "%s%s%si %c%d, %c%d, %zu";
    uVar12 = *(ulong *)((long)i + 0x10);
LAB_0010cc2c:
    printf(__format,pcVar10,pcVar11,pcVar6,(ulong)uVar14,(ulong)uVar9,uVar13,uVar15,uVar12);
    break;
  case 7:
    pcVar10 = dill_type_names[uVar9 & 0xf];
    uVar13 = (ulong)*(int *)((long)i + 8);
    if ((long)uVar13 < 100) {
      uVar15 = 0x50;
    }
    else {
      iVar3 = dill_type_of(c,*(int *)((long)i + 8));
      uVar15 = (ulong)((uint)(iVar3 != 0xc) << 4 | 0x42);
      uVar13 = (ulong)*(uint *)((long)i + 8);
    }
    printf("set%s %c%d, %zx",pcVar10,uVar15,uVar13,*(undefined8 *)((long)i + 0x10));
    break;
  case 8:
    uVar13 = *(ulong *)((long)i + 0x10);
    pcVar10 = dill_type_names[uVar9 & 0xf];
    uVar15 = (ulong)*(int *)((long)i + 8);
    if ((long)uVar15 < 100) {
      uVar7 = 0x50;
      uVar12 = uVar13;
    }
    else {
      iVar3 = dill_type_of(c,*(int *)((long)i + 8));
      uVar7 = (ulong)((uint)(iVar3 != 0xc) << 4 | 0x42);
      uVar15 = (ulong)*(uint *)((long)i + 8);
      uVar12 = *(ulong *)((long)i + 0x10);
    }
    printf("set%s %c%d, %g 0x(%x)0x(%x)",uVar12,pcVar10,uVar7,uVar15,uVar13 & 0xffffffff,
           uVar13 >> 0x20);
    break;
  case 9:
    pcVar10 = dill_type_names[uVar9 & 0xf];
    uVar13 = (ulong)*(int *)((long)i + 8);
    uVar9 = 0x50;
    uVar14 = 0x50;
    if (99 < (long)uVar13) {
      iVar3 = dill_type_of(c,*(int *)((long)i + 8));
      uVar14 = (uint)(iVar3 != 0xc) << 4 | 0x42;
      uVar13 = (ulong)*(uint *)((long)i + 8);
    }
    uVar15 = (ulong)*(int *)((long)i + 0xc);
    if (99 < (long)uVar15) {
      iVar3 = dill_type_of(c,*(int *)((long)i + 0xc));
      uVar9 = (uint)(iVar3 != 0xc) << 4 | 0x42;
      uVar15 = (ulong)*(uint *)((long)i + 0xc);
    }
    pcVar11 = "mov%s %c%d, %c%d";
LAB_0010c527:
    printf(pcVar11,pcVar10,(ulong)uVar14,uVar13 & 0xffffffff,(ulong)uVar9,uVar15);
    break;
  case 10:
    pcVar10 = dill_type_names[uVar9 & 0xf];
    uVar8 = *(undefined8 *)((long)i + 0x10);
    pcVar11 = "ret%si %zu";
    goto LAB_0010cd36;
  case 0xb:
    pdVar2 = c->p;
    pcVar10 = branch_op_names[(char)bVar1];
    uVar13 = (ulong)*(int *)((long)i + 8);
    uVar9 = 0x50;
    uVar14 = 0x50;
    if (99 < (long)uVar13) {
      iVar3 = dill_type_of(c,*(int *)((long)i + 8));
      uVar14 = (uint)(iVar3 != 0xc) << 4 | 0x42;
      uVar13 = (ulong)*(uint *)((long)i + 8);
    }
    uVar15 = (ulong)*(int *)((long)i + 0xc);
    if (99 < (long)uVar15) {
      iVar3 = dill_type_of(c,*(int *)((long)i + 0xc));
      uVar9 = (uint)(iVar3 != 0xc) << 4 | 0x42;
      uVar15 = (ulong)*(uint *)((long)i + 0xc);
    }
    printf("b%s %c%d, %c%d, L%d",pcVar10,(ulong)uVar14,uVar13 & 0xffffffff,(ulong)uVar9,uVar15,
           (ulong)*(uint *)((long)i + 0x10));
    ppcVar4 = (pdVar2->branch_table).label_name;
    goto LAB_0010c878;
  case 0xc:
    pdVar2 = c->p;
    pcVar10 = branch_op_names[(char)bVar1];
    uVar13 = (ulong)*(int *)((long)i + 8);
    if ((long)uVar13 < 100) {
      uVar15 = 0x50;
    }
    else {
      iVar3 = dill_type_of(c,*(int *)((long)i + 8));
      uVar15 = (ulong)((uint)(iVar3 != 0xc) << 4 | 0x42);
      uVar13 = (ulong)*(uint *)((long)i + 8);
    }
    printf("b%si %c%d, %p, L%d",pcVar10,uVar15,uVar13,*(undefined8 *)((long)i + 0x18),
           (ulong)*(uint *)((long)i + 0xc));
    ppcVar4 = (pdVar2->branch_table).label_name;
    lVar5 = (long)*(int *)((long)i + 0xc);
    goto LAB_0010cb1c;
  case 0xd:
    pdVar2 = c->p;
    printf("br L%d",(ulong)*(uint *)((long)i + 0x10));
    ppcVar4 = (pdVar2->branch_table).label_name;
LAB_0010c878:
    lVar5 = (long)*(int *)((long)i + 0x10);
    goto LAB_0010cb1c;
  case 0xe:
    if (*(int *)((long)i + 8) != 1) {
      if (*(int *)((long)i + 8) != 0) {
        return 0x28;
      }
      pcVar10 = "special NOP";
      goto LAB_0010c4ab;
    }
    pcVar10 = prefix_names_rel + *(int *)(prefix_names_rel + *(long *)((long)i + 0x10) * 4);
    pcVar11 = "special SEGMENTED %s";
    goto LAB_0010cb30;
  case 0xf:
    uVar13 = (ulong)*(int *)((long)i + 8);
    if ((long)uVar13 < 100) {
      uVar15 = 0x50;
    }
    else {
      iVar3 = dill_type_of(c,*(int *)((long)i + 8));
      uVar15 = (ulong)((uint)(iVar3 != 0xc) << 4 | 0x42);
      uVar13 = (ulong)*(uint *)((long)i + 8);
    }
    printf("jmp %c%d",uVar15,uVar13);
    break;
  case 0x10:
    pcVar10 = *(char **)((long)i + 0x10);
    pcVar11 = "jmp 0x%p";
    goto LAB_0010cb30;
  case 0x11:
    uVar14 = *(uint *)((long)i + 8);
    if ((short)uVar14 < 0) {
      if ((uVar14 & 0xffff) != 0xffff) {
        printf("pushinit varidiac, %d nonvar args",(ulong)(-(int)(short)uVar14 - 2));
        return 0x28;
      }
      pcVar10 = "pushinit";
      goto LAB_0010c4ab;
    }
    pcVar10 = dill_type_names[uVar9 & 0xf];
    uVar13 = 0x50;
    if (99 < (int)uVar14) {
      iVar3 = dill_type_of(c,uVar14);
      uVar13 = (ulong)((uint)(iVar3 != 0xc) << 4 | 0x42);
      uVar14 = *(uint *)((long)i + 8);
    }
    uVar15 = (ulong)uVar14;
    pcVar11 = "push%s %c%d";
LAB_0010cb60:
    printf(pcVar11,pcVar10,uVar13,uVar15);
    break;
  case 0x12:
    if ((ulong)(uVar9 & 0xf) == 8) {
      uVar8 = *(undefined8 *)((long)i + 0x10);
      pcVar11 = "push%si 0x%p";
      pcVar10 = dill_type_names[8];
    }
    else {
      pcVar10 = dill_type_names[uVar9 & 0xf];
      uVar8 = *(undefined8 *)((long)i + 0x10);
      pcVar11 = "push%si 0x%zx";
    }
    goto LAB_0010cd36;
  case 0x13:
    printf("push%si %g",*(undefined8 *)((long)i + 0x10),dill_type_names[(char)bVar1]);
    break;
  case 0x14:
    uVar13 = (ulong)(uVar9 & 0xf);
    if (uVar13 != 0xb) {
      if ((bVar1 & 0x10) == 0) {
        lVar5 = *(long *)((long)i + 0x20);
        pcVar10 = dill_type_names[uVar13];
        uVar8 = *(undefined8 *)((long)i + 0x10);
        uVar9 = *(uint *)((long)i + 8);
        uVar13 = (ulong)uVar9;
        if (lVar5 != 0) {
          uVar15 = 0x50;
          if (99 < (int)uVar9) {
            iVar3 = dill_type_of(c,uVar9);
            uVar15 = (ulong)((uint)(iVar3 != 0xc) << 4 | 0x42);
            uVar13 = (ulong)*(uint *)((long)i + 8);
          }
          printf("call%s 0x%p<%s>, %c%d",pcVar10,uVar8,lVar5,uVar15,uVar13);
          return 0x28;
        }
        uVar15 = 0x50;
        if (99 < (int)uVar9) {
          iVar3 = dill_type_of(c,uVar9);
          uVar15 = (ulong)((uint)(iVar3 != 0xc) << 4 | 0x42);
          uVar13 = (ulong)*(uint *)((long)i + 8);
        }
        pcVar11 = "call%s 0x%p, %c%d";
      }
      else {
        pcVar10 = dill_type_names[uVar13];
        uVar8 = *(undefined8 *)((long)i + 0x18);
        uVar13 = (ulong)*(int *)((long)i + 8);
        if ((long)uVar13 < 100) {
          uVar15 = 0x50;
        }
        else {
          iVar3 = dill_type_of(c,*(int *)((long)i + 8));
          uVar15 = (ulong)((uint)(iVar3 != 0xc) << 4 | 0x42);
          uVar13 = (ulong)*(uint *)((long)i + 8);
        }
        pcVar11 = "call%s R%p, %c%d";
      }
      printf(pcVar11,pcVar10,uVar8,uVar15,uVar13);
      return 0x28;
    }
    pcVar10 = dill_type_names[0xb];
    if ((bVar1 & 0x10) == 0) {
      uVar8 = *(undefined8 *)((long)i + 0x10);
      if (*(long *)((long)i + 0x20) != 0) {
        printf("call%s 0x%p<%s>",dill_type_names[0xb],uVar8);
        return 0x28;
      }
      pcVar11 = "call%s 0x%p";
    }
    else {
      uVar8 = *(undefined8 *)((long)i + 0x18);
      pcVar11 = "call%s R%p";
    }
LAB_0010cd36:
    printf(pcVar11,pcVar10,uVar8);
    break;
  case 0x15:
    uVar13 = (ulong)*(int *)((long)i + 8);
    uVar9 = 0x50;
    uVar14 = 0x50;
    if (99 < (long)uVar13) {
      iVar3 = dill_type_of(c,*(int *)((long)i + 8));
      uVar14 = (uint)(iVar3 != 0xc) << 4 | 0x42;
      uVar13 = (ulong)*(uint *)((long)i + 8);
    }
    uVar15 = (ulong)*(int *)((long)i + 0xc);
    if (99 < (long)uVar15) {
      iVar3 = dill_type_of(c,*(int *)((long)i + 0xc));
      uVar9 = (uint)(iVar3 != 0xc) << 4 | 0x42;
      uVar15 = (ulong)*(uint *)((long)i + 0xc);
    }
    printf("lea %c%d, %c%d, %zx",(ulong)uVar14,uVar13 & 0xffffffff,(ulong)uVar9,uVar15,
           *(undefined8 *)((long)i + 0x10));
    break;
  case 0x16:
    ppcVar4 = compare_op_names;
LAB_0010c9eb:
    pcVar10 = ppcVar4[(char)bVar1];
    uVar13 = (ulong)*(int *)((long)i + 8);
    uVar9 = 0x50;
    uVar14 = 0x50;
    if (99 < (long)uVar13) {
      iVar3 = dill_type_of(c,*(int *)((long)i + 8));
      uVar14 = (uint)(iVar3 != 0xc) << 4 | 0x42;
      uVar13 = (ulong)*(uint *)((long)i + 8);
    }
    uVar15 = (ulong)*(int *)((long)i + 0xc);
    if (99 < (long)uVar15) {
      iVar3 = dill_type_of(c,*(int *)((long)i + 0xc));
      uVar9 = (uint)(iVar3 != 0xc) << 4 | 0x42;
      uVar15 = (ulong)*(uint *)((long)i + 0xc);
    }
    if (*(int *)((long)i + 0x10) < 100) {
      uVar12 = 0x50;
    }
    else {
      iVar3 = dill_type_of(c,*(int *)((long)i + 0x10));
      uVar12 = (ulong)((uint)(iVar3 != 0xc) << 4 | 0x42);
    }
    pcVar11 = "%s%s%s %c%d, %c%d, %c%d";
    uVar15 = uVar15 & 0xffffffff;
LAB_0010caa1:
    printf(pcVar11 + 4,pcVar10,(ulong)uVar14,uVar13 & 0xffffffff,(ulong)uVar9,uVar15,uVar12);
    break;
  case 0x17:
    pdVar2 = c->p;
    printf("L%d:",(ulong)*(uint *)((long)i + 8));
    ppcVar4 = (pdVar2->branch_table).label_name;
    lVar5 = (long)*(int *)((long)i + 8);
LAB_0010cb1c:
    pcVar10 = ppcVar4[lVar5];
    if (pcVar10 != (char *)0x0) {
      pcVar11 = "<%s>";
LAB_0010cb30:
      printf(pcVar11,pcVar10);
    }
    break;
  case 0x18:
    pcVar10 = "nop";
LAB_0010c4ab:
    printf(pcVar10);
  }
  return 0x28;
}

Assistant:

extern int
virtual_print_insn(dill_stream c, void* info_ptr, void* i)
{
    virtual_insn* insn = (virtual_insn*)i;
    int insn_code = insn->insn_code;
    switch (insn->class_code) {
    case iclass_arith3:
        printf("%s %c%d, %c%d, %c%d", arith3_name[insn_code],
               OPND(insn->opnds.a3.dest), OPND(insn->opnds.a3.src1),
               OPND(insn->opnds.a3.src2));
        break;
    case iclass_arith3i:
        printf("%si %c%d, %c%d, %zu", arith3_name[insn_code],
               OPND(insn->opnds.a3i.dest), OPND(insn->opnds.a3i.src),
               insn->opnds.a3i.u.imm);
        break;
    case iclass_arith2:
        printf("%s %c%d, %c%d", arith2_name[insn_code],
               OPND(insn->opnds.a2.dest), OPND(insn->opnds.a2.src));
        break;
    case iclass_convert: {
        int from_index = (insn->insn_code >> 4) & 0xf;
        int to_index = insn->insn_code & 0xf;
        printf("cv%s2%s %c%d, %c%d", dill_type_names[from_index],
               dill_type_names[to_index], OPND(insn->opnds.a2.dest),
               OPND(insn->opnds.a2.src));
        break;
    }
    case iclass_loadstore: {
        int typ = insn->insn_code & 0xf;
        int store = (insn->insn_code & 0x10) == 0x10;
        int bswap = (insn->insn_code & 0x20) == 0x20;
        printf("%s%s%s %c%d, %c%d, %c%d", bswap ? "bs" : "",
               store == 0 ? "ld" : "st", dill_type_names[typ],
               OPND(insn->opnds.a3.dest), OPND(insn->opnds.a3.src1),
               OPND(insn->opnds.a3.src2));
        break;
    }
    case iclass_loadstorei: {
        int typ = insn->insn_code & 0xf;
        int store = (insn->insn_code & 0x10) == 0x10;
        int bswap = (insn->insn_code & 0x20) == 0x20;
        printf("%s%s%si %c%d, %c%d, %zu", bswap ? "bs" : "",
               store == 0 ? "ld" : "st", dill_type_names[typ],
               OPND(insn->opnds.a3i.dest), OPND(insn->opnds.a3i.src),
               insn->opnds.a3i.u.imm);
        break;
    }
    case iclass_lea: {
        printf("lea %c%d, %c%d, %zx", OPND(insn->opnds.a3i.dest),
               OPND(insn->opnds.a3i.src), insn->opnds.a3i.u.imm);
        break;
    }
    case iclass_set: {
        int typ = insn->insn_code & 0xf;
        printf("set%s %c%d, %zx", dill_type_names[typ],
               OPND(insn->opnds.a3i.dest), insn->opnds.a3i.u.imm);
        break;
    }
    case iclass_setf: {
        int typ = insn->insn_code & 0xf;
        union {
            double imm;
            int imm_i[2];
        } u;
        u.imm = insn->opnds.sf.imm;
        printf("set%s %c%d, %g 0x(%x)0x(%x)", dill_type_names[typ],
               OPND(insn->opnds.sf.dest), insn->opnds.sf.imm, u.imm_i[0],
               u.imm_i[1]);
        break;
    }
    case iclass_mov: {
        int typ = insn->insn_code & 0xf;
        printf("mov%s %c%d, %c%d", dill_type_names[typ],
               OPND(insn->opnds.a2.dest), OPND(insn->opnds.a2.src));
        break;
    }
    case iclass_reti: {
        int typ = insn->insn_code & 0xf;
        printf("ret%si %zu", dill_type_names[typ], insn->opnds.a3i.u.imm);
        break;
    }
    case iclass_ret: {
        int typ = insn->insn_code & 0xf;
        printf("ret%s %c%d", dill_type_names[typ], OPND(insn->opnds.a1.src));
        break;
    }
    case iclass_branch: {
        int br_op = insn->insn_code;
        struct branch_table* t = &c->p->branch_table;
        printf("b%s %c%d, %c%d, L%d", branch_op_names[br_op],
               OPND(insn->opnds.br.src1), OPND(insn->opnds.br.src2),
               insn->opnds.br.label);
        if (t->label_name[insn->opnds.br.label] != NULL) {
            printf("<%s>", t->label_name[insn->opnds.br.label]);
        }
        break;
    }
    case iclass_compare: {
        int c_op = insn->insn_code;
        printf("%s %c%d, %c%d, %c%d", compare_op_names[c_op],
               OPND(insn->opnds.a3.dest), OPND(insn->opnds.a3.src1),
               OPND(insn->opnds.a3.src2));
        break;
    }
    case iclass_branchi: {
        int br_op = insn->insn_code;
        struct branch_table* t = &c->p->branch_table;
        printf("b%si %c%d, %p, L%d", branch_op_names[br_op],
               OPND(insn->opnds.bri.src), (void*)insn->opnds.bri.imm_l,
               insn->opnds.bri.label);
        if (t->label_name[insn->opnds.bri.label] != NULL) {
            printf("<%s>", t->label_name[insn->opnds.bri.label]);
        }
        break;
    }
    case iclass_jump_to_label: {
        struct branch_table* t = &c->p->branch_table;
        printf("br L%d", insn->opnds.br.label);
        if (t->label_name[insn->opnds.br.label] != NULL) {
            printf("<%s>", t->label_name[insn->opnds.br.label]);
        }
        break;
    }
    case iclass_mark_label: {
        struct branch_table* t = &c->p->branch_table;
        printf("L%d:", insn->opnds.label.label);
        if (t->label_name[insn->opnds.label.label] != NULL) {
            printf("<%s>", t->label_name[insn->opnds.label.label]);
        }
        break;
    }
    case iclass_jump_to_reg: {
        printf("jmp %c%d", OPND(insn->opnds.br.src1));
        break;
    }
    case iclass_jump_to_imm: {
        printf("jmp 0x%p", insn->opnds.bri.imm_a);
        break;
    }
    case iclass_special: {
        switch (insn->opnds.spec.type) {
        case DILL_NOP:
            printf("special NOP");
            break;
        case DILL_SEGMENTED_FOLLOWS:
            printf("special SEGMENTED %s",
                   prefix_names[insn->opnds.spec.param]);
            break;
        }
        break;
    }
    case iclass_call: {
        int typ = insn->insn_code & 0xf;
        int reg = insn->insn_code & 0x10;
        if (typ != DILL_V) {
            if (reg != 0) {
                printf("call%s R%p, %c%d", dill_type_names[typ],
                       (void*)insn->opnds.calli.imm_l,
                       OPND(insn->opnds.calli.src));
            } else {
                const char* call_name = insn->opnds.calli.xfer_name;
                if (call_name) {
                    printf("call%s 0x%p<%s>, %c%d", dill_type_names[typ],
                           insn->opnds.calli.imm_a, call_name,
                           OPND(insn->opnds.calli.src));
                } else {
                    printf("call%s 0x%p, %c%d", dill_type_names[typ],
                           insn->opnds.calli.imm_a,
                           OPND(insn->opnds.calli.src));
                }
            }
        } else {
            if (reg != 0) {
                printf("call%s R%p", dill_type_names[typ],
                       (void*)insn->opnds.calli.imm_l);
            } else {
                const char* call_name = insn->opnds.calli.xfer_name;
                if (call_name) {
                    printf("call%s 0x%p<%s>", dill_type_names[typ],
                           insn->opnds.calli.imm_a, call_name);
                } else {
                    printf("call%s 0x%p", dill_type_names[typ],
                           insn->opnds.calli.imm_a);
                }
            }
        }
        break;
    }
    case iclass_push: {
        int typ = insn->insn_code & 0xf;
        if ((short)insn->opnds.a1.src < 0) {
            if ((short)insn->opnds.a1.src == -1) {
                printf("pushinit");
            } else {
                int non_var_arg = -((short)insn->opnds.a1.src) - 2;
                printf("pushinit varidiac, %d nonvar args", non_var_arg);
            }
        } else {
            printf("push%s %c%d", dill_type_names[typ],
                   OPND(insn->opnds.a1.src));
        }
        break;
    }
    case iclass_pushi: {
        int typ = insn->insn_code & 0xf;
        if (typ == DILL_P) {
            printf("push%si 0x%p", dill_type_names[typ],
                   insn->opnds.a3i.u.imm_a);
        } else {
            printf("push%si 0x%zx", dill_type_names[typ],
                   insn->opnds.a3i.u.imm);
        }
        break;
    }
    case iclass_pushf: {
        int typ = insn->insn_code;
        printf("push%si %g", dill_type_names[typ], insn->opnds.sf.imm);
        break;
    }
    case iclass_nop:
        printf("nop");
    }
    return sizeof(*insn);
}